

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffdtdm(fitsfile *fptr,char *tdimstr,int colnum,int maxdim,int *naxis,long *naxes,int *status)

{
  long local_c0;
  tcolumn *colptr;
  char message [81];
  char *local_58;
  char *lastloc;
  char *loc;
  long totalpix;
  long dimsize;
  long *naxes_local;
  int *naxis_local;
  int maxdim_local;
  int colnum_local;
  char *tdimstr_local;
  fitsfile *fptr_local;
  
  loc = (char *)0x1;
  local_c0 = 0;
  if (0 < *status) {
    return *status;
  }
  dimsize = (long)naxes;
  naxes_local = (long *)naxis;
  naxis_local._0_4_ = maxdim;
  naxis_local._4_4_ = colnum;
  _maxdim_local = tdimstr;
  tdimstr_local = (char *)fptr;
  if (colnum != 0) {
    if (fptr->HDUposition != fptr->Fptr->curhdu) {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    if ((naxis_local._4_4_ < 1) ||
       (*(int *)(*(long *)(tdimstr_local + 8) + 0x3b0) < naxis_local._4_4_)) {
      *status = 0x12e;
      return 0x12e;
    }
    local_c0 = *(long *)(*(long *)(tdimstr_local + 8) + 0x3d0) +
               (long)(naxis_local._4_4_ + -1) * 0xa0;
    if (*_maxdim_local == '\0') {
      *(undefined4 *)naxes_local = 1;
      if (0 < (int)naxis_local) {
        *(undefined8 *)dimsize = *(undefined8 *)(local_c0 + 0x58);
      }
      return *status;
    }
  }
  *(undefined4 *)naxes_local = 0;
  lastloc = strchr(_maxdim_local,0x28);
  if (lastloc == (char *)0x0) {
    snprintf((char *)&colptr,0x51,"Illegal dimensions format: %s",_maxdim_local);
    *status = 0x107;
    fptr_local._4_4_ = 0x107;
  }
  else {
    for (; lastloc != (char *)0x0; lastloc = strchr(lastloc,0x2c)) {
      lastloc = lastloc + 1;
      totalpix = strtol(lastloc,&lastloc,10);
      if ((int)*naxes_local < (int)naxis_local) {
        *(long *)(dimsize + (long)(int)*naxes_local * 8) = totalpix;
      }
      if (totalpix < 0) {
        ffpmsg("one or more dimension are less than 0 (ffdtdm)");
        ffpmsg(_maxdim_local);
        *status = 0x107;
        return 0x107;
      }
      loc = (char *)(totalpix * (long)loc);
      *(int *)naxes_local = (int)*naxes_local + 1;
      local_58 = lastloc;
    }
    lastloc = strchr(local_58,0x29);
    if (lastloc == (char *)0x0) {
      snprintf((char *)&colptr,0x51,"Illegal dimensions format: %s",_maxdim_local);
      *status = 0x107;
      fptr_local._4_4_ = 0x107;
    }
    else if (((naxis_local._4_4_ == 0) || (*(int *)(local_c0 + 0x50) < 1)) ||
            (*(char **)(local_c0 + 0x58) == loc)) {
      fptr_local._4_4_ = *status;
    }
    else {
      snprintf((char *)&colptr,0x51,
               "column vector length, %ld, does not equal TDIMn array size, %ld",
               *(undefined8 *)(local_c0 + 0x58),loc);
      ffpmsg((char *)&colptr);
      ffpmsg(_maxdim_local);
      *status = 0x107;
      fptr_local._4_4_ = 0x107;
    }
  }
  return fptr_local._4_4_;
}

Assistant:

int ffdtdm(fitsfile *fptr,  /* I - FITS file pointer                        */
           char *tdimstr,   /* I - TDIMn keyword value string. e.g. (10,10) */
           int colnum,      /* I - number of the column             */
           int maxdim,      /* I - maximum no. of dimensions to read;       */
           int *naxis,      /* O - number of axes in the data array         */
           long naxes[],    /* O - length of each data axis                 */
           int *status)     /* IO - error status                            */
/*
  decode the TDIMnnn keyword to get the dimensionality of a column.
  Check that the value is legal and consistent with the TFORM value.
  If colnum = 0, then the validity checking is disabled.
*/
{
    long dimsize, totalpix = 1;
    char *loc, *lastloc, message[FLEN_ERRMSG];
    tcolumn *colptr = 0;

    if (*status > 0)
        return(*status);

    if (colnum != 0) {
        if (fptr->HDUposition != (fptr->Fptr)->curhdu)
            ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

        if (colnum < 1 || colnum > (fptr->Fptr)->tfield)
            return(*status = BAD_COL_NUM);

        colptr = (fptr->Fptr)->tableptr;   /* set pointer to the first column */
        colptr += (colnum - 1);    /* increment to the correct column */

        if (!tdimstr[0])   /* TDIMn keyword doesn't exist? */
        {
            *naxis = 1;                   /* default = 1 dimensional */
            if (maxdim > 0)
                naxes[0] = (long) colptr->trepeat; /* default length = repeat */

            return(*status);
        }
    }

    *naxis = 0;

    loc = strchr(tdimstr, '(' );  /* find the opening quote */
    if (!loc)
    {
            snprintf(message, FLEN_ERRMSG, "Illegal dimensions format: %s", tdimstr);
            return(*status = BAD_TDIM);
    }

    while (loc)
    {
            loc++;
            dimsize = strtol(loc, &loc, 10);  /* read size of next dimension */
            if (*naxis < maxdim)
                naxes[*naxis] = dimsize;

            if (dimsize < 0)
            {
                ffpmsg("one or more dimension are less than 0 (ffdtdm)");
                ffpmsg(tdimstr);
                return(*status = BAD_TDIM);
            }

            totalpix *= dimsize;
            (*naxis)++;
            lastloc = loc;
            loc = strchr(loc, ',');  /* look for comma before next dimension */
    }

    loc = strchr(lastloc, ')' );  /* check for the closing quote */
    if (!loc)
    {
            snprintf(message, FLEN_ERRMSG, "Illegal dimensions format: %s", tdimstr);
            return(*status = BAD_TDIM);
    }

    if (colnum != 0) {
        if ((colptr->tdatatype > 0) && ((long) colptr->trepeat != totalpix))
        {
          snprintf(message, FLEN_ERRMSG,
          "column vector length, %ld, does not equal TDIMn array size, %ld",
          (long) colptr->trepeat, totalpix);
          ffpmsg(message);
          ffpmsg(tdimstr);
          return(*status = BAD_TDIM);
        }
    }
    return(*status);
}